

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlUInteger.cpp
# Opt level: O0

filepos_t __thiscall
libebml::EbmlUInteger::RenderData(EbmlUInteger *this,IOCallback *output,bool param_2,bool param_3)

{
  IOCallback *this_00;
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  uint local_3c;
  uint64 uStack_38;
  uint i;
  uint64 TempValue;
  binary FinalData [8];
  bool param_3_local;
  bool param_2_local;
  IOCallback *output_local;
  EbmlUInteger *this_local;
  
  FinalData[0] = param_3;
  FinalData[1] = param_2;
  unique0x1000013a = output;
  iVar1 = EbmlElement::GetSizeLength(&this->super_EbmlElement);
  if (iVar1 < 9) {
    uStack_38 = this->Value;
    local_3c = 0;
    while( true ) {
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      this_00 = stack0xffffffffffffffe0;
      if (CONCAT44(extraout_var,iVar1) <= (ulong)local_3c) break;
      iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
      *(char *)((long)&TempValue + (CONCAT44(extraout_var_00,iVar1) - (ulong)local_3c) + 5) =
           (char)uStack_38;
      uStack_38 = uStack_38 >> 8;
      local_3c = local_3c + 1;
    }
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    IOCallback::writeFully(this_00,(void *)((long)&TempValue + 6),CONCAT44(extraout_var_01,iVar1));
    iVar1 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])();
    this_local = (EbmlUInteger *)CONCAT44(extraout_var_02,iVar1);
  }
  else {
    this_local = (EbmlUInteger *)0x0;
  }
  return (filepos_t)this_local;
}

Assistant:

filepos_t EbmlUInteger::RenderData(IOCallback & output, bool /* bForceRender */, bool /* bWithDefault */)
{
  binary FinalData[8]; // we don't handle more than 64 bits integers

  if (GetSizeLength() > 8)
    return 0; // integer bigger coded on more than 64 bits are not supported

  uint64 TempValue = Value;
  for (unsigned int i=0; i<GetSize();i++) {
    FinalData[GetSize()-i-1] = TempValue & 0xFF;
    TempValue >>= 8;
  }

  output.writeFully(FinalData,GetSize());

  return GetSize();
}